

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)8>,true>
          (Thread *this)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  Simd<unsigned_short,_(unsigned_char)__b_> SVar5;
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  
  SVar5 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  auVar1._8_4_ = 0;
  auVar1._0_8_ = SVar5.v._0_8_;
  auVar1._12_2_ = SVar5.v[3];
  auVar2._8_2_ = SVar5.v[2];
  auVar2._0_8_ = SVar5.v._0_8_;
  auVar2._10_4_ = auVar1._10_4_;
  auVar4._6_8_ = 0;
  auVar4._0_6_ = auVar2._8_6_;
  auVar3._6_8_ = SUB148(auVar4 << 0x40,6);
  auVar3._4_2_ = SVar5.v[1];
  auVar3._2_2_ = 0;
  auVar3._0_2_ = SVar5.v[0];
  value.v._0_8_ = auVar3._0_8_;
  value.v[3] = auVar1._10_4_ >> 0x10;
  value.v[2] = auVar2._8_4_;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}